

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

Aig_Man_t *
Aig_ManRegCreatePart
          (Aig_Man_t *pAig,Vec_Int_t *vPart,int *pnCountPis,int *pnCountRegs,int **ppMapBack)

{
  int iVar1;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *p_00;
  void *pvVar3;
  Aig_Man_t *p_01;
  Aig_Obj_t *pAVar4;
  int *__s;
  ulong uVar5;
  Aig_Obj_t *p1;
  size_t __size;
  int iVar6;
  int iVar7;
  int iVar8;
  
  p = Vec_PtrAlloc(vPart->nSize);
  iVar6 = pAig->nObjs[3];
  iVar8 = pAig->nRegs;
  for (iVar7 = 0; iVar7 < vPart->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vPart,iVar7);
    pAVar2 = Aig_ManCo(pAig,iVar1 + (iVar6 - iVar8));
    Vec_PtrPush(p,(void *)((ulong)pAVar2->pFanin0 & 0xfffffffffffffffe));
  }
  p_00 = Aig_ManDfsNodes(pAig,(Aig_Obj_t **)p->pArray,p->nSize);
  Vec_PtrFree(p);
  iVar6 = pAig->nObjs[2];
  iVar8 = pAig->nRegs;
  for (iVar7 = 0; iVar7 < vPart->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vPart,iVar7);
    pAVar2 = Aig_ManCi(pAig,iVar1 + (iVar6 - iVar8));
    pAVar2->TravId = pAig->nTravIds + -1;
  }
  iVar6 = 0;
  for (iVar8 = 0; iVar7 = pAig->nObjs[2] - pAig->nRegs, iVar8 < iVar7; iVar8 = iVar8 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,iVar8);
    iVar6 = iVar6 + (uint)(*(int *)((long)pvVar3 + 0x20) == pAig->nTravIds);
  }
  iVar8 = 0;
  for (; iVar7 < pAig->vCis->nSize; iVar7 = iVar7 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,iVar7);
    iVar8 = iVar8 + (uint)(*(int *)((long)pvVar3 + 0x20) == pAig->nTravIds);
  }
  if (pnCountPis != (int *)0x0) {
    *pnCountPis = iVar6;
  }
  if (pnCountRegs != (int *)0x0) {
    *pnCountRegs = iVar8;
  }
  p_01 = Aig_ManStart(p_00->nSize);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_01->pConst1;
  for (iVar6 = 0; iVar6 < pAig->vCis->nSize; iVar6 = iVar6 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,iVar6);
    if (*(int *)((long)pvVar3 + 0x20) == pAig->nTravIds) {
      pAVar2 = Aig_ObjCreateCi(p_01);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar2;
    }
  }
  iVar6 = pAig->nObjs[2];
  iVar8 = pAig->nRegs;
  for (iVar7 = 0; iVar7 < vPart->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vPart,iVar7);
    pAVar2 = Aig_ManCi(pAig,iVar1 + (iVar6 - iVar8));
    pAVar4 = Aig_ObjCreateCi(p_01);
    (pAVar2->field_5).pData = pAVar4;
    Aig_ObjCreateCo(p_01,pAVar4);
    pAVar2->TravId = pAig->nTravIds;
  }
  iVar6 = 0;
  do {
    if (p_00->nSize <= iVar6) {
      iVar6 = pAig->nObjs[3];
      iVar8 = pAig->nRegs;
      for (iVar7 = 0; iVar7 < vPart->nSize; iVar7 = iVar7 + 1) {
        iVar1 = Vec_IntEntry(vPart,iVar7);
        pAVar2 = Aig_ManCo(pAig,iVar1 + (iVar6 - iVar8));
        pAVar2 = Aig_ObjChild0Copy(pAVar2);
        Aig_ObjCreateCo(p_01,pAVar2);
      }
      p_01->nRegs = vPart->nSize;
      if (ppMapBack != (int **)0x0) {
        __size = (long)p_01->vObjs->nSize << 2;
        __s = (int *)malloc(__size);
        memset(__s,0xff,__size);
        *__s = 0;
        for (iVar6 = 0; iVar6 < p_00->nSize; iVar6 = iVar6 + 1) {
          pvVar3 = Vec_PtrEntry(p_00,iVar6);
          __s[*(int *)((*(ulong *)((long)pvVar3 + 0x28) & 0xfffffffffffffffe) + 0x24)] =
               *(int *)((long)pvVar3 + 0x24);
        }
        iVar6 = pAig->nObjs[2];
        iVar8 = pAig->nRegs;
        for (iVar7 = 0; iVar7 < vPart->nSize; iVar7 = iVar7 + 1) {
          iVar1 = Vec_IntEntry(vPart,iVar7);
          pAVar2 = Aig_ManCi(pAig,iVar1 + (iVar6 - iVar8));
          __s[*(int *)((long)(pAVar2->field_5).pData + 0x24)] = pAVar2->Id;
        }
        *ppMapBack = __s;
      }
      Vec_PtrFree(p_00);
      return p_01;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar6);
    if (0xfffffffd < (*(uint *)&pAVar2->field_0x18 & 7) - 7) {
      pAVar4 = Aig_ObjChild0Copy(pAVar2);
      if (((ulong)pAVar2 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar5 = (ulong)pAVar2->pFanin1 & 0xfffffffffffffffe;
      if (uVar5 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pAVar2->pFanin1 & 1) ^ *(ulong *)(uVar5 + 0x28));
      }
      pAVar4 = Aig_And(p_01,pAVar4,p1);
      (pAVar2->field_5).pData = pAVar4;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Aig_ManRegCreatePart( Aig_Man_t * pAig, Vec_Int_t * vPart, int * pnCountPis, int * pnCountRegs, int ** ppMapBack )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vRoots;
    int nOffset, iOut, i;
    int nCountPis, nCountRegs;
    int * pMapBack;
    // collect roots
    vRoots = Vec_PtrAlloc( Vec_IntSize(vPart) );
    nOffset = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCo(pAig, nOffset+iOut);
        Vec_PtrPush( vRoots, Aig_ObjFanin0(pObj) );
    }
    // collect/mark nodes/PIs in the DFS order
    vNodes = Aig_ManDfsNodes( pAig, (Aig_Obj_t **)Vec_PtrArray(vRoots), Vec_PtrSize(vRoots) );
    Vec_PtrFree( vRoots );
    // unmark register outputs
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCi(pAig, nOffset+iOut);
        Aig_ObjSetTravIdPrevious( pAig, pObj );
    }
    // count pure PIs
    nCountPis = nCountRegs = 0;
    Aig_ManForEachPiSeq( pAig, pObj, i )
        nCountPis += Aig_ObjIsTravIdCurrent(pAig, pObj);
    // count outputs of other registers
    Aig_ManForEachLoSeq( pAig, pObj, i )
        nCountRegs += Aig_ObjIsTravIdCurrent(pAig, pObj); 
    if ( pnCountPis )
        *pnCountPis = nCountPis;
    if ( pnCountRegs )
        *pnCountRegs = nCountRegs;
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes) );
    Aig_ManConst1(pAig)->pData = Aig_ManConst1(pNew);
    // create the PIs
    Aig_ManForEachCi( pAig, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(pAig, pObj) )
            pObj->pData = Aig_ObjCreateCi(pNew);
    // add variables for the register outputs
    // create fake POs to hold the register outputs
    nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCi(pAig, nOffset+iOut);
        pObj->pData = Aig_ObjCreateCi(pNew);
        Aig_ObjCreateCo( pNew, (Aig_Obj_t *)pObj->pData );
        Aig_ObjSetTravIdCurrent( pAig, pObj ); // added
    }
    // create the nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsNode(pObj) )
            pObj->pData = Aig_And(pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add real POs for the registers
    nOffset = Aig_ManCoNum(pAig)-Aig_ManRegNum(pAig);
    Vec_IntForEachEntry( vPart, iOut, i )
    {
        pObj = Aig_ManCo( pAig, nOffset+iOut );
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    pNew->nRegs = Vec_IntSize(vPart);
    // create map
    if ( ppMapBack )
    {
        pMapBack = ABC_ALLOC( int, Aig_ManObjNumMax(pNew) );
        memset( pMapBack, 0xff, sizeof(int) * Aig_ManObjNumMax(pNew) );
        // map constant nodes
        pMapBack[0] = 0;
        // logic cones of register outputs
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        {
            pObjNew = Aig_Regular((Aig_Obj_t *)pObj->pData);
            pMapBack[pObjNew->Id] = pObj->Id;
        }
        // map register outputs
        nOffset = Aig_ManCiNum(pAig)-Aig_ManRegNum(pAig);
        Vec_IntForEachEntry( vPart, iOut, i )
        {
            pObj = Aig_ManCi(pAig, nOffset+iOut);
            pObjNew = (Aig_Obj_t *)pObj->pData;
            pMapBack[pObjNew->Id] = pObj->Id;
        }
        *ppMapBack = pMapBack;
    }
    Vec_PtrFree( vNodes );
    return pNew;
}